

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O0

void hal_vdpu384a_record_scaling_list
               (scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  RK_U8 *p_data_4;
  RK_S32 pos_2;
  RK_U8 *p_data_3;
  int local_78;
  RK_S32 blk4_y_2;
  RK_S32 blk4_x_2;
  RK_S32 pos_1;
  RK_U8 *p_data_2;
  int local_60;
  RK_S32 blk4_y_1;
  RK_S32 blk4_x_1;
  RK_S32 pos;
  RK_U8 *p_data_1;
  RK_S32 blk4_y;
  RK_S32 blk4_x;
  RK_U8 *p_data;
  BitputCtx_t bp;
  RK_U32 listId;
  RK_S32 i;
  scalingList_t *pScalingList_local;
  scalingFactor_t *pScalingFactor_out_local;
  
  mpp_set_bitput_ctx((BitputCtx_t *)&p_data,(RK_U64 *)pScalingFactor_out,0xaa);
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  for (; uVar1 = bp._24_4_, (uint)bp._24_4_ < 6; bp._24_4_ = bp._24_4_ + 1) {
    for (bp.size = 0; (int)bp.size < 4; bp.size = bp.size + 1) {
      mpp_put_bits((BitputCtx_t *)&p_data,(ulong)pScalingList->sl[0][(uint)uVar1][(int)bp.size],8);
      mpp_put_bits((BitputCtx_t *)&p_data,
                   (ulong)pScalingList->sl[0][(uint)uVar1][(int)(bp.size + 4)],8);
      mpp_put_bits((BitputCtx_t *)&p_data,
                   (ulong)pScalingList->sl[0][(uint)uVar1][(int)(bp.size + 8)],8);
      mpp_put_bits((BitputCtx_t *)&p_data,
                   (ulong)pScalingList->sl[0][(uint)uVar1][(int)(bp.size + 0xc)],8);
    }
  }
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  for (; (uint)bp._24_4_ < 6; bp._24_4_ = bp._24_4_ + 1) {
    uVar3 = (ulong)(uint)bp._24_4_;
    for (p_data_1._4_4_ = 0; p_data_1._4_4_ < 8; p_data_1._4_4_ = p_data_1._4_4_ + 4) {
      for (p_data_1._0_4_ = 0; (int)p_data_1 < 8; p_data_1._0_4_ = (int)p_data_1 + 4) {
        iVar2 = (int)p_data_1 * 8 + p_data_1._4_4_;
        for (bp.size = 0; (int)bp.size < 4; bp.size = bp.size + 1) {
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[1][uVar3][(int)(iVar2 + bp.size)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[1][uVar3][(int)(iVar2 + bp.size + 8)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[1][uVar3][(int)(iVar2 + bp.size + 0x10)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[1][uVar3][(int)(iVar2 + bp.size + 0x18)],8);
        }
      }
    }
  }
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  for (; (uint)bp._24_4_ < 6; bp._24_4_ = bp._24_4_ + 1) {
    uVar3 = (ulong)(uint)bp._24_4_;
    for (local_60 = 0; local_60 < 8; local_60 = local_60 + 4) {
      for (p_data_2._4_4_ = 0; p_data_2._4_4_ < 8; p_data_2._4_4_ = p_data_2._4_4_ + 4) {
        iVar2 = p_data_2._4_4_ * 8 + local_60;
        for (bp.size = 0; (int)bp.size < 4; bp.size = bp.size + 1) {
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[2][uVar3][(int)(iVar2 + bp.size)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[2][uVar3][(int)(iVar2 + bp.size + 8)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[2][uVar3][(int)(iVar2 + bp.size + 0x10)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[2][uVar3][(int)(iVar2 + bp.size + 0x18)],8);
        }
      }
    }
  }
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  for (; (uint)bp._24_4_ < 6; bp._24_4_ = bp._24_4_ + 1) {
    uVar3 = (ulong)(uint)bp._24_4_;
    for (local_78 = 0; local_78 < 8; local_78 = local_78 + 4) {
      for (p_data_3._4_4_ = 0; p_data_3._4_4_ < 8; p_data_3._4_4_ = p_data_3._4_4_ + 4) {
        iVar2 = p_data_3._4_4_ * 8 + local_78;
        for (bp.size = 0; (int)bp.size < 4; bp.size = bp.size + 1) {
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[3][uVar3][(int)(iVar2 + bp.size)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[3][uVar3][(int)(iVar2 + bp.size + 8)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[3][uVar3][(int)(iVar2 + bp.size + 0x10)],8);
          mpp_put_bits((BitputCtx_t *)&p_data,
                       (ulong)pScalingList->sl[3][uVar3][(int)(iVar2 + bp.size + 0x18)],8);
        }
      }
    }
  }
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  for (; (uint)bp._24_4_ < 6; bp._24_4_ = bp._24_4_ + 1) {
    uVar3 = (ulong)(uint)bp._24_4_;
    for (bp.size = 0; (int)bp.size < 0x10; bp.size = bp.size + 1) {
      mpp_put_bits((BitputCtx_t *)&p_data,(ulong)pScalingList->sl[0][uVar3][(int)bp.size],8);
    }
  }
  for (bp.size = 0; (int)bp.size < 6; bp.size = bp.size + 1) {
    mpp_put_bits((BitputCtx_t *)&p_data,(ulong)pScalingList->sl_dc[0][(int)bp.size],8);
  }
  for (bp.size = 0; (int)bp.size < 6; bp.size = bp.size + 1) {
    mpp_put_bits((BitputCtx_t *)&p_data,(ulong)pScalingList->sl_dc[1][(int)bp.size],8);
  }
  mpp_put_align((BitputCtx_t *)&p_data,0x80,0);
  return;
}

Assistant:

void hal_vdpu384a_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 listId;
    BitputCtx_t bp;

    mpp_set_bitput_ctx(&bp, (RK_U64 *)pScalingFactor_out, 170); // 170*64bits

    //-------- following make it by hardware needed --------
    //sizeId == 0, block4x4
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];
        /* dump by block4x4, vectial direction */
        for (i = 0; i < 4; i++) {
            mpp_put_bits(&bp, p_data[i + 0], 8);
            mpp_put_bits(&bp, p_data[i + 4], 8);
            mpp_put_bits(&bp, p_data[i + 8], 8);
            mpp_put_bits(&bp, p_data[i + 12], 8);
        }
    }
    //sizeId == 1, block8x8
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[1][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 2, block16x16
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[2][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 3, blcok32x32
    for (listId = 0; listId < 6; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[3][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 0, block4x4, horiztion direction */
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];

        for (i = 0; i < 16; i++)
            mpp_put_bits(&bp, p_data[i], 8);
    }

    // dump dc value
    for (i = 0; i < SCALING_LIST_NUM; i++)//sizeId = 2, 16x16
        mpp_put_bits(&bp, pScalingList->sl_dc[0][i], 8);
    for (i = 0; i < SCALING_LIST_NUM; i++) //sizeId = 3, 32x32
        mpp_put_bits(&bp, pScalingList->sl_dc[1][i], 8);

    mpp_put_align(&bp, 128, 0);
}